

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<tinyusdz::value::quatd>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,quatd *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<tinyusdz::value::quatd> local_e0;
  undefined1 local_b8 [8];
  optional<tinyusdz::value::quatd> pv_1;
  optional<tinyusdz::value::quatd> local_88;
  undefined1 local_60 [8];
  optional<tinyusdz::value::quatd> pv;
  quatd *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (quatd *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_00601cfa;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)((long)&pv.contained + 0x18),t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)((long)&pv.contained + 0x18));
  if (bVar1) {
    get_default_value<tinyusdz::value::quatd>(&local_88,this);
    nonstd::optional_lite::optional<tinyusdz::value::quatd>::optional<tinyusdz::value::quatd,_0>
              ((optional<tinyusdz::value::quatd> *)local_60,&local_88);
    nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional(&local_88);
    pv_1.contained._28_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_60);
    if ((bool)pv_1.contained._28_1_) {
      pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::quatd>::value
                         ((optional<tinyusdz::value::quatd> *)local_60);
      (v->imag)._M_elems[0] = (pvVar2->imag)._M_elems[0];
      (v->imag)._M_elems[1] = (pvVar2->imag)._M_elems[1];
      (v->imag)._M_elems[2] = (pvVar2->imag)._M_elems[2];
      v->real = pvVar2->real;
      this_local._7_1_ = 1;
    }
    pv_1.contained._29_3_ = 0;
    nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional
              ((optional<tinyusdz::value::quatd> *)local_60);
    if (pv_1.contained._28_4_ != 0) goto LAB_00601cfa;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_00601cfa;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<tinyusdz::value::quatd,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<tinyusdz::value::quatd>(&local_e0,this);
      nonstd::optional_lite::optional<tinyusdz::value::quatd>::optional<tinyusdz::value::quatd,_0>
                ((optional<tinyusdz::value::quatd> *)local_b8,&local_e0);
      nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional(&local_e0);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_b8);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<tinyusdz::value::quatd>::value
                           ((optional<tinyusdz::value::quatd> *)local_b8);
        (v->imag)._M_elems[0] = (pvVar2->imag)._M_elems[0];
        (v->imag)._M_elems[1] = (pvVar2->imag)._M_elems[1];
        (v->imag)._M_elems[2] = (pvVar2->imag)._M_elems[2];
        v->real = pvVar2->real;
        this_local._7_1_ = 1;
      }
      pv_1.contained._29_3_ = 0;
      pv_1.contained._28_1_ = bVar1;
      nonstd::optional_lite::optional<tinyusdz::value::quatd>::~optional
                ((optional<tinyusdz::value::quatd> *)local_b8);
      if (pv_1.contained._28_4_ != 0) goto LAB_00601cfa;
    }
    this_local._7_1_ = 0;
  }
LAB_00601cfa:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }